

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIStaticText.cpp
# Opt level: O1

void __thiscall irr::gui::CGUIStaticText::~CGUIStaticText(CGUIStaticText *this,void **vtt)

{
  int *piVar1;
  void *pvVar2;
  IGUIFont *pIVar3;
  _func_int *p_Var4;
  
  pvVar2 = *vtt;
  *(void **)this = pvVar2;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar2 + -0x18)) = vtt[5];
  pIVar3 = this->OverrideFont;
  if (pIVar3 != (IGUIFont *)0x0) {
    p_Var4 = pIVar3->_vptr_IGUIFont[-3];
    piVar1 = (int *)(&pIVar3->field_0x10 + (long)p_Var4);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (**(code **)(*(long *)((long)&pIVar3->_vptr_IGUIFont + (long)p_Var4) + 8))();
    }
  }
  std::vector<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>::~vector
            (&(this->BrokenText).m_data);
  IGUIElement::~IGUIElement((IGUIElement *)this,vtt + 2);
  return;
}

Assistant:

CGUIStaticText::~CGUIStaticText()
{
	if (OverrideFont)
		OverrideFont->drop();
}